

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeRangeTestCase.cpp
# Opt level: O0

void __thiscall SuiteTimeRangeTests::TestisInSameRange::RunImpl(TestisInSameRange *this)

{
  TestResults *pTVar1;
  bool bVar2;
  TestResults **ppTVar3;
  TestDetails **ppTVar4;
  TestDetails local_770 [2];
  TestDetails local_730;
  UtcTimeStamp local_710;
  UtcTimeStamp local_6f8;
  UtcTimeOnly local_6e0;
  UtcTimeOnly local_6c8 [2];
  TestDetails local_690 [2];
  TestDetails local_650;
  UtcTimeStamp local_630;
  UtcTimeStamp local_618 [2];
  TestDetails local_5e0 [2];
  TestDetails local_5a0;
  UtcTimeStamp local_580;
  UtcTimeStamp local_568 [2];
  TestDetails local_530 [2];
  TestDetails local_4f0;
  UtcTimeStamp local_4d0;
  UtcTimeStamp local_4b8 [2];
  TestDetails local_480 [2];
  TestDetails local_440;
  UtcTimeStamp local_420;
  UtcTimeStamp local_408;
  UtcTimeOnly local_3f0;
  UtcTimeOnly local_3d8 [2];
  TestDetails local_3a0 [2];
  TestDetails local_360;
  UtcTimeStamp local_340;
  UtcTimeStamp local_328 [2];
  TestDetails local_2f0 [2];
  TestDetails local_2b0;
  UtcTimeStamp local_290;
  UtcTimeStamp local_278 [2];
  TestDetails local_240 [2];
  TestDetails local_200;
  UtcTimeStamp local_1e0;
  UtcTimeStamp local_1c8 [2];
  TestDetails local_190 [2];
  TestDetails local_150;
  UtcTimeStamp local_130;
  UtcTimeStamp local_118 [2];
  TestDetails local_e0 [2];
  TestDetails local_a0;
  undefined1 local_80 [8];
  UtcTimeStamp time2;
  UtcTimeStamp time1;
  undefined1 local_40 [8];
  UtcTimeOnly end;
  UtcTimeOnly start;
  TestisInSameRange *this_local;
  
  FIX::UtcTimeOnly::UtcTimeOnly((UtcTimeOnly *)&end.super_DateTime.m_time,3,0,0,0);
  FIX::UtcTimeOnly::UtcTimeOnly((UtcTimeOnly *)local_40,0x12,0,0,0);
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&time2.super_DateTime.m_time,10,0,0,10,10,2000);
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)local_80,10,0,0,10,10,2000);
  bVar2 = FIX::TimeRange::isInSameRange
                    ((UtcTimeOnly *)&end.super_DateTime.m_time,(UtcTimeOnly *)local_40,
                     (DateTime *)&time2.super_DateTime.m_time,(DateTime *)local_80);
  bVar2 = UnitTest::Check<bool>(bVar2);
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_a0,*ppTVar4,0xbb);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_a0,"TimeRange::isInSameRange( start, end, time1, time2 )");
  }
  bVar2 = FIX::TimeRange::isInSameRange
                    ((UtcTimeOnly *)&end.super_DateTime.m_time,(UtcTimeOnly *)local_40,
                     (DateTime *)local_80,(DateTime *)&time2.super_DateTime.m_time);
  bVar2 = UnitTest::Check<bool>(bVar2);
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(local_e0,*ppTVar4,0xbc);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,local_e0,"TimeRange::isInSameRange( start, end, time2, time1 )");
  }
  FIX::UtcTimeStamp::UtcTimeStamp(local_118,10,0,0,10,10,2000);
  FIX::UtcTimeStamp::operator=((UtcTimeStamp *)&time2.super_DateTime.m_time,local_118);
  FIX::UtcTimeStamp::~UtcTimeStamp(local_118);
  FIX::UtcTimeStamp::UtcTimeStamp(&local_130,0xb,0,0,10,10,2000);
  FIX::UtcTimeStamp::operator=((UtcTimeStamp *)local_80,&local_130);
  FIX::UtcTimeStamp::~UtcTimeStamp(&local_130);
  bVar2 = FIX::TimeRange::isInSameRange
                    ((UtcTimeOnly *)&end.super_DateTime.m_time,(UtcTimeOnly *)local_40,
                     (DateTime *)&time2.super_DateTime.m_time,(DateTime *)local_80);
  bVar2 = UnitTest::Check<bool>(bVar2);
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_150,*ppTVar4,0xc1);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_150,"TimeRange::isInSameRange( start, end, time1, time2 )");
  }
  bVar2 = FIX::TimeRange::isInSameRange
                    ((UtcTimeOnly *)&end.super_DateTime.m_time,(UtcTimeOnly *)local_40,
                     (DateTime *)local_80,(DateTime *)&time2.super_DateTime.m_time);
  bVar2 = UnitTest::Check<bool>(bVar2);
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(local_190,*ppTVar4,0xc2);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,local_190,"TimeRange::isInSameRange( start, end, time2, time1 )");
  }
  FIX::UtcTimeStamp::UtcTimeStamp(local_1c8,0xb,0,0,10,10,2000);
  FIX::UtcTimeStamp::operator=((UtcTimeStamp *)&time2.super_DateTime.m_time,local_1c8);
  FIX::UtcTimeStamp::~UtcTimeStamp(local_1c8);
  FIX::UtcTimeStamp::UtcTimeStamp(&local_1e0,10,0,0,10,10,2000);
  FIX::UtcTimeStamp::operator=((UtcTimeStamp *)local_80,&local_1e0);
  FIX::UtcTimeStamp::~UtcTimeStamp(&local_1e0);
  bVar2 = FIX::TimeRange::isInSameRange
                    ((UtcTimeOnly *)&end.super_DateTime.m_time,(UtcTimeOnly *)local_40,
                     (DateTime *)&time2.super_DateTime.m_time,(DateTime *)local_80);
  bVar2 = UnitTest::Check<bool>(bVar2);
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_200,*ppTVar4,199);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_200,"TimeRange::isInSameRange( start, end, time1, time2 )");
  }
  bVar2 = FIX::TimeRange::isInSameRange
                    ((UtcTimeOnly *)&end.super_DateTime.m_time,(UtcTimeOnly *)local_40,
                     (DateTime *)local_80,(DateTime *)&time2.super_DateTime.m_time);
  bVar2 = UnitTest::Check<bool>(bVar2);
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(local_240,*ppTVar4,200);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,local_240,"TimeRange::isInSameRange( start, end, time2, time1 )");
  }
  FIX::UtcTimeStamp::UtcTimeStamp(local_278,0x13,0,0,10,10,2000);
  FIX::UtcTimeStamp::operator=((UtcTimeStamp *)&time2.super_DateTime.m_time,local_278);
  FIX::UtcTimeStamp::~UtcTimeStamp(local_278);
  FIX::UtcTimeStamp::UtcTimeStamp(&local_290,10,0,0,10,10,2000);
  FIX::UtcTimeStamp::operator=((UtcTimeStamp *)local_80,&local_290);
  FIX::UtcTimeStamp::~UtcTimeStamp(&local_290);
  bVar2 = FIX::TimeRange::isInSameRange
                    ((UtcTimeOnly *)&end.super_DateTime.m_time,(UtcTimeOnly *)local_40,
                     (DateTime *)&time2.super_DateTime.m_time,(DateTime *)local_80);
  bVar2 = UnitTest::Check<bool>((bool)(~bVar2 & 1));
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_2b0,*ppTVar4,0xcd);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_2b0,"!TimeRange::isInSameRange( start, end, time1, time2 )");
  }
  bVar2 = FIX::TimeRange::isInSameRange
                    ((UtcTimeOnly *)&end.super_DateTime.m_time,(UtcTimeOnly *)local_40,
                     (DateTime *)local_80,(DateTime *)&time2.super_DateTime.m_time);
  bVar2 = UnitTest::Check<bool>((bool)(~bVar2 & 1));
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(local_2f0,*ppTVar4,0xce);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,local_2f0,"!TimeRange::isInSameRange( start, end, time2, time1 )");
  }
  FIX::UtcTimeStamp::UtcTimeStamp(local_328,10,0,0,10,10,2000);
  FIX::UtcTimeStamp::operator=((UtcTimeStamp *)&time2.super_DateTime.m_time,local_328);
  FIX::UtcTimeStamp::~UtcTimeStamp(local_328);
  FIX::UtcTimeStamp::UtcTimeStamp(&local_340,2,0,0,10,10,2000);
  FIX::UtcTimeStamp::operator=((UtcTimeStamp *)local_80,&local_340);
  FIX::UtcTimeStamp::~UtcTimeStamp(&local_340);
  bVar2 = FIX::TimeRange::isInSameRange
                    ((UtcTimeOnly *)&end.super_DateTime.m_time,(UtcTimeOnly *)local_40,
                     (DateTime *)&time2.super_DateTime.m_time,(DateTime *)local_80);
  bVar2 = UnitTest::Check<bool>((bool)(~bVar2 & 1));
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_360,*ppTVar4,0xd3);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_360,"!TimeRange::isInSameRange( start, end, time1, time2 )");
  }
  bVar2 = FIX::TimeRange::isInSameRange
                    ((UtcTimeOnly *)&end.super_DateTime.m_time,(UtcTimeOnly *)local_40,
                     (DateTime *)local_80,(DateTime *)&time2.super_DateTime.m_time);
  bVar2 = UnitTest::Check<bool>((bool)(~bVar2 & 1));
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(local_3a0,*ppTVar4,0xd4);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,local_3a0,"!TimeRange::isInSameRange( start, end, time2, time1 )");
  }
  FIX::UtcTimeOnly::UtcTimeOnly(local_3d8,0x12,0,0,0);
  FIX::UtcTimeOnly::operator=((UtcTimeOnly *)&end.super_DateTime.m_time,local_3d8);
  FIX::UtcTimeOnly::~UtcTimeOnly(local_3d8);
  FIX::UtcTimeOnly::UtcTimeOnly(&local_3f0,3,0,0,0);
  FIX::UtcTimeOnly::operator=((UtcTimeOnly *)local_40,&local_3f0);
  FIX::UtcTimeOnly::~UtcTimeOnly(&local_3f0);
  FIX::UtcTimeStamp::UtcTimeStamp(&local_408,0x13,0,0,10,10,2000);
  FIX::UtcTimeStamp::operator=((UtcTimeStamp *)&time2.super_DateTime.m_time,&local_408);
  FIX::UtcTimeStamp::~UtcTimeStamp(&local_408);
  FIX::UtcTimeStamp::UtcTimeStamp(&local_420,0x14,0,0,10,10,2000);
  FIX::UtcTimeStamp::operator=((UtcTimeStamp *)local_80,&local_420);
  FIX::UtcTimeStamp::~UtcTimeStamp(&local_420);
  bVar2 = FIX::TimeRange::isInSameRange
                    ((UtcTimeOnly *)&end.super_DateTime.m_time,(UtcTimeOnly *)local_40,
                     (DateTime *)&time2.super_DateTime.m_time,(DateTime *)local_80);
  bVar2 = UnitTest::Check<bool>(bVar2);
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_440,*ppTVar4,0xdd);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_440,"TimeRange::isInSameRange( start, end, time1, time2 )");
  }
  bVar2 = FIX::TimeRange::isInSameRange
                    ((UtcTimeOnly *)&end.super_DateTime.m_time,(UtcTimeOnly *)local_40,
                     (DateTime *)local_80,(DateTime *)&time2.super_DateTime.m_time);
  bVar2 = UnitTest::Check<bool>(bVar2);
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(local_480,*ppTVar4,0xde);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,local_480,"TimeRange::isInSameRange( start, end, time2, time1 )");
  }
  FIX::UtcTimeStamp::UtcTimeStamp(local_4b8,0x13,0,0,10,10,2000);
  FIX::UtcTimeStamp::operator=((UtcTimeStamp *)&time2.super_DateTime.m_time,local_4b8);
  FIX::UtcTimeStamp::~UtcTimeStamp(local_4b8);
  FIX::UtcTimeStamp::UtcTimeStamp(&local_4d0,2,0,0,0xb,10,2000);
  FIX::UtcTimeStamp::operator=((UtcTimeStamp *)local_80,&local_4d0);
  FIX::UtcTimeStamp::~UtcTimeStamp(&local_4d0);
  bVar2 = FIX::TimeRange::isInSameRange
                    ((UtcTimeOnly *)&end.super_DateTime.m_time,(UtcTimeOnly *)local_40,
                     (DateTime *)&time2.super_DateTime.m_time,(DateTime *)local_80);
  bVar2 = UnitTest::Check<bool>(bVar2);
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_4f0,*ppTVar4,0xe3);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_4f0,"TimeRange::isInSameRange( start, end, time1, time2 )");
  }
  bVar2 = FIX::TimeRange::isInSameRange
                    ((UtcTimeOnly *)&end.super_DateTime.m_time,(UtcTimeOnly *)local_40,
                     (DateTime *)local_80,(DateTime *)&time2.super_DateTime.m_time);
  bVar2 = UnitTest::Check<bool>(bVar2);
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(local_530,*ppTVar4,0xe4);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,local_530,"TimeRange::isInSameRange( start, end, time2, time1 )");
  }
  FIX::UtcTimeStamp::UtcTimeStamp(local_568,2,0,0,0xb,10,2000);
  FIX::UtcTimeStamp::operator=((UtcTimeStamp *)&time2.super_DateTime.m_time,local_568);
  FIX::UtcTimeStamp::~UtcTimeStamp(local_568);
  FIX::UtcTimeStamp::UtcTimeStamp(&local_580,0x13,0,0,10,10,2000);
  FIX::UtcTimeStamp::operator=((UtcTimeStamp *)local_80,&local_580);
  FIX::UtcTimeStamp::~UtcTimeStamp(&local_580);
  bVar2 = FIX::TimeRange::isInSameRange
                    ((UtcTimeOnly *)&end.super_DateTime.m_time,(UtcTimeOnly *)local_40,
                     (DateTime *)&time2.super_DateTime.m_time,(DateTime *)local_80);
  bVar2 = UnitTest::Check<bool>(bVar2);
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_5a0,*ppTVar4,0xe9);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_5a0,"TimeRange::isInSameRange( start, end, time1, time2 )");
  }
  bVar2 = FIX::TimeRange::isInSameRange
                    ((UtcTimeOnly *)&end.super_DateTime.m_time,(UtcTimeOnly *)local_40,
                     (DateTime *)local_80,(DateTime *)&time2.super_DateTime.m_time);
  bVar2 = UnitTest::Check<bool>(bVar2);
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(local_5e0,*ppTVar4,0xea);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,local_5e0,"TimeRange::isInSameRange( start, end, time2, time1 )");
  }
  FIX::UtcTimeStamp::UtcTimeStamp(local_618,0x15,0,0,0xb,10,2000);
  FIX::UtcTimeStamp::operator=((UtcTimeStamp *)&time2.super_DateTime.m_time,local_618);
  FIX::UtcTimeStamp::~UtcTimeStamp(local_618);
  FIX::UtcTimeStamp::UtcTimeStamp(&local_630,0x14,0,0,10,10,2000);
  FIX::UtcTimeStamp::operator=((UtcTimeStamp *)local_80,&local_630);
  FIX::UtcTimeStamp::~UtcTimeStamp(&local_630);
  bVar2 = FIX::TimeRange::isInSameRange
                    ((UtcTimeOnly *)&end.super_DateTime.m_time,(UtcTimeOnly *)local_40,
                     (DateTime *)&time2.super_DateTime.m_time,(DateTime *)local_80);
  bVar2 = UnitTest::Check<bool>((bool)(~bVar2 & 1));
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_650,*ppTVar4,0xef);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_650,"!TimeRange::isInSameRange( start, end, time1, time2 )");
  }
  bVar2 = FIX::TimeRange::isInSameRange
                    ((UtcTimeOnly *)&end.super_DateTime.m_time,(UtcTimeOnly *)local_40,
                     (DateTime *)local_80,(DateTime *)&time2.super_DateTime.m_time);
  bVar2 = UnitTest::Check<bool>((bool)(~bVar2 & 1));
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(local_690,*ppTVar4,0xf0);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,local_690,"!TimeRange::isInSameRange( start, end, time2, time1 )");
  }
  FIX::UtcTimeOnly::UtcTimeOnly(local_6c8,6,0,0,0);
  FIX::UtcTimeOnly::operator=((UtcTimeOnly *)&end.super_DateTime.m_time,local_6c8);
  FIX::UtcTimeOnly::~UtcTimeOnly(local_6c8);
  FIX::UtcTimeOnly::UtcTimeOnly(&local_6e0,6,0,0,0);
  FIX::UtcTimeOnly::operator=((UtcTimeOnly *)local_40,&local_6e0);
  FIX::UtcTimeOnly::~UtcTimeOnly(&local_6e0);
  FIX::UtcTimeStamp::UtcTimeStamp(&local_6f8,0x13,10,0,1,0xd,0x7d4);
  FIX::UtcTimeStamp::operator=((UtcTimeStamp *)&time2.super_DateTime.m_time,&local_6f8);
  FIX::UtcTimeStamp::~UtcTimeStamp(&local_6f8);
  FIX::UtcTimeStamp::UtcTimeStamp(&local_710,0x13,6,0,1,0xe,0x7d4);
  FIX::UtcTimeStamp::operator=((UtcTimeStamp *)local_80,&local_710);
  FIX::UtcTimeStamp::~UtcTimeStamp(&local_710);
  bVar2 = FIX::TimeRange::isInSameRange
                    ((UtcTimeOnly *)&end.super_DateTime.m_time,(UtcTimeOnly *)local_40,
                     (DateTime *)&time2.super_DateTime.m_time,(DateTime *)local_80);
  bVar2 = UnitTest::Check<bool>((bool)(~bVar2 & 1));
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_730,*ppTVar4,0xf7);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_730,"!TimeRange::isInSameRange( start, end, time1, time2 )");
  }
  bVar2 = FIX::TimeRange::isInSameRange
                    ((UtcTimeOnly *)&end.super_DateTime.m_time,(UtcTimeOnly *)local_40,
                     (DateTime *)local_80,(DateTime *)&time2.super_DateTime.m_time);
  bVar2 = UnitTest::Check<bool>((bool)(~bVar2 & 1));
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(local_770,*ppTVar4,0xf8);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,local_770,"!TimeRange::isInSameRange( start, end, time2, time1 )");
  }
  FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)local_80);
  FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)&time2.super_DateTime.m_time);
  FIX::UtcTimeOnly::~UtcTimeOnly((UtcTimeOnly *)local_40);
  FIX::UtcTimeOnly::~UtcTimeOnly((UtcTimeOnly *)&end.super_DateTime.m_time);
  return;
}

Assistant:

TEST(isInSameRange)
{
  // start time is less than end time
  UtcTimeOnly start( 3, 0, 0 );
  UtcTimeOnly end( 18, 0, 0 );

  // same time
  UtcTimeStamp time1( 10, 0, 0, 10, 10, 2000 );
  UtcTimeStamp time2( 10, 0, 0, 10, 10, 2000 );
  CHECK( TimeRange::isInSameRange( start, end, time1, time2 ) );
  CHECK( TimeRange::isInSameRange( start, end, time2, time1 ) );

  // time 2 in same session but greater
  time1 = UtcTimeStamp( 10, 0, 0, 10, 10, 2000 );
  time2 = UtcTimeStamp( 11, 0, 0, 10, 10, 2000 );
  CHECK( TimeRange::isInSameRange( start, end, time1, time2 ) );
  CHECK( TimeRange::isInSameRange( start, end, time2, time1 ) );

  // time 2 in same session but less
  time1 = UtcTimeStamp( 11, 0, 0, 10, 10, 2000 );
  time2 = UtcTimeStamp( 10, 0, 0, 10, 10, 2000 );
  CHECK( TimeRange::isInSameRange( start, end, time1, time2 ) );
  CHECK( TimeRange::isInSameRange( start, end, time2, time1 ) );

  // time 1 not in session
  time1 = UtcTimeStamp( 19, 0, 0, 10, 10, 2000 );
  time2 = UtcTimeStamp( 10, 0, 0, 10, 10, 2000 );
  CHECK( !TimeRange::isInSameRange( start, end, time1, time2 ) );
  CHECK( !TimeRange::isInSameRange( start, end, time2, time1 ) );

  // time 2 not in session
  time1 = UtcTimeStamp( 10, 0, 0, 10, 10, 2000 );
  time2 = UtcTimeStamp( 2, 0, 0, 10, 10, 2000 );
  CHECK( !TimeRange::isInSameRange( start, end, time1, time2 ) );
  CHECK( !TimeRange::isInSameRange( start, end, time2, time1 ) );

  // start time is greater than end time
  start = UtcTimeOnly( 18, 0, 0 );
  end = UtcTimeOnly( 3, 0, 0 );

  // same session same day
  time1 = UtcTimeStamp( 19, 0, 0, 10, 10, 2000 );
  time2 = UtcTimeStamp( 20, 0, 0, 10, 10, 2000 );
  CHECK( TimeRange::isInSameRange( start, end, time1, time2 ) );
  CHECK( TimeRange::isInSameRange( start, end, time2, time1 ) );

  // same session time 2 is in next day
  time1 = UtcTimeStamp( 19, 0, 0, 10, 10, 2000 );
  time2 = UtcTimeStamp( 2, 0, 0, 11, 10, 2000 );
  CHECK( TimeRange::isInSameRange( start, end, time1, time2 ) );
  CHECK( TimeRange::isInSameRange( start, end, time2, time1 ) );

  // same session time 1 is in next day
  time1 = UtcTimeStamp( 2, 0, 0, 11, 10, 2000 );
  time2 = UtcTimeStamp( 19, 0, 0, 10, 10, 2000 );
  CHECK( TimeRange::isInSameRange( start, end, time1, time2 ) );
  CHECK( TimeRange::isInSameRange( start, end, time2, time1 ) );

  // time 1 is 25 hours greater than time 2
  time1 = UtcTimeStamp( 21, 0, 0, 11, 10, 2000 );
  time2 = UtcTimeStamp( 20, 0, 0, 10, 10, 2000 );
  CHECK( !TimeRange::isInSameRange( start, end, time1, time2 ) );
  CHECK( !TimeRange::isInSameRange( start, end, time2, time1 ) );

  // start time is greater than end time
  start = UtcTimeOnly( 6, 0, 0 );
  end = UtcTimeOnly( 6, 0, 0 );
  time1 = UtcTimeStamp( 19, 10, 0, 1, 13, 2004 );
  time2 = UtcTimeStamp( 19, 06, 0, 1, 14, 2004 );
  CHECK( !TimeRange::isInSameRange( start, end, time1, time2 ) );
  CHECK( !TimeRange::isInSameRange( start, end, time2, time1 ) );
}